

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 floatx80_sqrt_m68k(floatx80 a,float_status *status)

{
  undefined1 auVar1 [12];
  ushort uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong b;
  ulong uVar10;
  ulong uVar11;
  ulong a0;
  byte bVar12;
  uint aExp;
  uint64_t uVar13;
  bool bVar14;
  bool bVar15;
  floatx80 fVar16;
  floatx80 fVar17;
  ulong local_50;
  uint64_t term1;
  uint64_t local_40;
  uint64_t term0;
  
  uVar8 = a._8_8_;
  uVar11 = a.low;
  uVar2 = a.high;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)uVar11 < 0)
  {
    if ((uVar2 & 0x7fff) == 0x7fff) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
        auVar1 = a._0_12_;
        fVar16._12_4_ = 0;
        fVar16.low = auVar1._0_8_;
        fVar16.high = auVar1._8_2_;
        fVar16._10_2_ = auVar1._10_2_;
        fVar16 = propagateFloatx80NaN_m68k(a,fVar16,status);
        auVar1 = fVar16._0_12_;
LAB_006506a4:
        uVar11 = auVar1._0_8_;
        uVar8 = (ulong)auVar1._8_4_;
        goto LAB_006506a9;
      }
      uVar8 = CONCAT62(a._10_6_,0x7fff);
      if (-1 < (short)uVar2) goto LAB_006506a9;
    }
    else {
      if (-1 < (short)uVar2) {
        if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
          if (uVar11 == 0) {
            uVar11 = 0;
            uVar8 = 0;
            goto LAB_006506a9;
          }
          uVar8 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          uVar11 = uVar11 << ((byte)(uVar8 ^ 0x3f) & 0x3f);
          aExp = 1 - (int)(uVar8 ^ 0x3f);
        }
        else {
          aExp = (uint)(uVar2 & 0x7fff);
        }
        uVar3 = estimateSqrt32(aExp,(uint32_t)(uVar11 >> 0x20));
        bVar12 = (byte)aExp & 1 | 2;
        uVar8 = uVar11 >> bVar12;
        uVar11 = uVar11 << (-bVar12 & 0x3f);
        uVar4 = estimateDiv128To64(uVar8,uVar11,(ulong)uVar3 << 0x20);
        lVar5 = (ulong)uVar3 * 0x40000000;
        uVar13 = lVar5 + uVar4;
        mul64To128(uVar13,uVar13,&term0,&term1);
        a0 = uVar11 - term1;
        lVar5 = lVar5 + uVar4;
        uVar13 = uVar13 * 2;
        for (lVar9 = (uVar8 - term0) - (ulong)(uVar11 < term1); lVar5 = lVar5 + -1, lVar9 < 0;
            lVar9 = (lVar9 - (lVar5 >> 0x3f)) + (ulong)bVar14) {
          bVar14 = CARRY8(a0,uVar13 - 1);
          a0 = a0 + (uVar13 - 1);
          uVar13 = uVar13 - 2;
        }
        uVar4 = estimateDiv128To64(a0,0,uVar13);
        if ((uVar4 & 0x3ffffffffffffffe) < 6) {
          b = uVar4 + (uVar4 == 0);
          mul64To128(uVar13,b,&term1,&local_50);
          bVar14 = local_50 != 0;
          uVar8 = -local_50;
          mul64To128(b,b,&local_50,&local_40);
          uVar6 = uVar8 - local_50;
          uVar10 = -local_40;
          uVar7 = uVar6 - (local_40 != 0);
          uVar11 = b * 2 - 1;
          uVar4 = b;
          for (lVar5 = (((a0 - term1) - (ulong)bVar14) - (ulong)(uVar8 < local_50)) -
                       (ulong)(uVar6 < (local_40 != 0)); uVar4 = uVar4 - 1, lVar5 < 0;
              lVar5 = lVar5 + (ulong)bVar14 + (ulong)(uVar7 < bVar15)) {
            bVar14 = -((long)uVar4 >> 0x3f) + uVar7 + uVar13 < uVar7;
            uVar7 = -((long)uVar4 >> 0x3f) + uVar7 + (ulong)CARRY8(uVar11,uVar10) + uVar13;
            bVar15 = CARRY8(uVar10,uVar11);
            uVar10 = uVar10 + uVar11;
            b = b - 1;
            uVar11 = uVar11 - 2;
          }
          uVar4 = b | ((uVar7 != 0 || lVar5 != 0) || uVar10 != 0);
        }
        fVar16 = roundAndPackFloatx80_m68k
                           (status->floatx80_rounding_precision,'\0',
                            ((int)(aExp - 0x3fff) >> 1) + 0x3fff,uVar13 - ((long)uVar4 >> 0x3f),
                            uVar4 * 2,status);
        auVar1 = fVar16._0_12_;
        goto LAB_006506a4;
      }
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 && uVar11 == 0)
      goto LAB_006506a9;
    }
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  uVar8 = CONCAT62((int6)(uVar8 >> 0x10),0x7fff);
  uVar11 = 0xffffffffffffffff;
LAB_006506a9:
  fVar17._8_8_ = uVar8 & 0xffffffff;
  fVar17.low = uVar11;
  return fVar17;
}

Assistant:

floatx80 floatx80_sqrt(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp, zExp;
    uint64_t aSig0, aSig1, zSig0, zSig1, doubleZSig0;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig0 = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig0 << 1)) {
            return propagateFloatx80NaN(a, a, status);
        }
        if ( ! aSign ) return a;
        goto invalid;
    }
    if ( aSign ) {
        if ( ( aExp | aSig0 ) == 0 ) return a;
 invalid:
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    if ( aExp == 0 ) {
        if ( aSig0 == 0 ) return packFloatx80( 0, 0, 0 );
        normalizeFloatx80Subnormal( aSig0, &aExp, &aSig0 );
    }
    zExp = ( ( aExp - 0x3FFF )>>1 ) + 0x3FFF;
    zSig0 = estimateSqrt32( aExp, aSig0>>32 );
    shift128Right( aSig0, 0, 2 + ( aExp & 1 ), &aSig0, &aSig1 );
    zSig0 = estimateDiv128To64( aSig0, aSig1, zSig0<<32 ) + ( zSig0<<30 );
    doubleZSig0 = zSig0<<1;
    mul64To128( zSig0, zSig0, &term0, &term1 );
    sub128( aSig0, aSig1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        doubleZSig0 -= 2;
        add128( rem0, rem1, zSig0>>63, doubleZSig0 | 1, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, doubleZSig0 );
    if ( ( zSig1 & UINT64_C(0x3FFFFFFFFFFFFFFF) ) <= 5 ) {
        if ( zSig1 == 0 ) zSig1 = 1;
        mul64To128( doubleZSig0, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        mul64To128( zSig1, zSig1, &term2, &term3 );
        sub192( rem1, rem2, 0, 0, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            shortShift128Left( 0, zSig1, 1, &term2, &term3 );
            term3 |= 1;
            term2 |= doubleZSig0;
            add192( rem1, rem2, rem3, 0, term2, term3, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shortShift128Left( 0, zSig1, 1, &zSig0, &zSig1 );
    zSig0 |= doubleZSig0;
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                0, zExp, zSig0, zSig1, status);
}